

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O3

batch __thiscall
ear::PolarExtentCoreSimd<xsimd::sse4_2>::weight_stadium
          (PolarExtentCoreSimd<xsimd::sse4_2> *this,PolarExtentCoreContext *ctx,
          PositionBatch<xsimd::batch<float,_xsimd::sse4_2>_> *position)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined4 extraout_EAX;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  batch bVar37;
  batch bVar38;
  batch bVar39;
  float local_58;
  float fStack_54;
  
  fVar32 = ctx->flippedBasis[0];
  fVar4 = ctx->flippedBasis[1];
  fVar5 = ctx->flippedBasis[2];
  fVar6 = ctx->flippedBasis[3];
  fVar7 = (position->x).super_simd_register<float,_xsimd::sse4_2>.
          super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
          super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[0];
  fVar8 = *(float *)((long)(position->x).super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data + 4);
  fVar31 = *(float *)((long)(position->x).super_simd_register<float,_xsimd::sse4_2>.
                            super_simd_register<float,_xsimd::sse4_1>.
                            super_simd_register<float,_xsimd::ssse3>.
                            super_simd_register<float,_xsimd::sse3>.
                            super_simd_register<float,_xsimd::sse2>.data + 8);
  fVar9 = *(float *)((long)(position->x).super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data + 0xc);
  fVar10 = (position->y).super_simd_register<float,_xsimd::sse4_2>.
           super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
           super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[0];
  fVar11 = *(float *)((long)(position->y).super_simd_register<float,_xsimd::sse4_2>.
                            super_simd_register<float,_xsimd::sse4_1>.
                            super_simd_register<float,_xsimd::ssse3>.
                            super_simd_register<float,_xsimd::sse3>.
                            super_simd_register<float,_xsimd::sse2>.data + 4);
  fVar12 = *(float *)((long)(position->y).super_simd_register<float,_xsimd::sse4_2>.
                            super_simd_register<float,_xsimd::sse4_1>.
                            super_simd_register<float,_xsimd::ssse3>.
                            super_simd_register<float,_xsimd::sse3>.
                            super_simd_register<float,_xsimd::sse2>.data + 8);
  fVar13 = *(float *)((long)(position->y).super_simd_register<float,_xsimd::sse4_2>.
                            super_simd_register<float,_xsimd::sse4_1>.
                            super_simd_register<float,_xsimd::ssse3>.
                            super_simd_register<float,_xsimd::sse3>.
                            super_simd_register<float,_xsimd::sse2>.data + 0xc);
  fVar14 = (position->z).super_simd_register<float,_xsimd::sse4_2>.
           super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
           super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[0];
  fVar15 = *(float *)((long)(position->z).super_simd_register<float,_xsimd::sse4_2>.
                            super_simd_register<float,_xsimd::sse4_1>.
                            super_simd_register<float,_xsimd::ssse3>.
                            super_simd_register<float,_xsimd::sse3>.
                            super_simd_register<float,_xsimd::sse2>.data + 4);
  fVar16 = *(float *)((long)(position->z).super_simd_register<float,_xsimd::sse4_2>.
                            super_simd_register<float,_xsimd::sse4_1>.
                            super_simd_register<float,_xsimd::ssse3>.
                            super_simd_register<float,_xsimd::sse3>.
                            super_simd_register<float,_xsimd::sse2>.data + 8);
  fVar17 = *(float *)((long)(position->z).super_simd_register<float,_xsimd::sse4_2>.
                            super_simd_register<float,_xsimd::sse4_1>.
                            super_simd_register<float,_xsimd::ssse3>.
                            super_simd_register<float,_xsimd::sse3>.
                            super_simd_register<float,_xsimd::sse2>.data + 0xc);
  fVar18 = ctx->flippedBasis[4];
  fVar19 = ctx->flippedBasis[5];
  fVar33 = fVar6 * fVar7 + fVar18 * fVar10 + fVar19 * fVar14;
  fVar34 = fVar6 * fVar8 + fVar18 * fVar11 + fVar19 * fVar15;
  bVar37.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data._8_8_ = (undefined8)DAT_001a7610;
  fVar35 = (float)((uint)(fVar32 * fVar7 + fVar4 * fVar10 + fVar5 * fVar14) & (uint)DAT_001a7610);
  fVar36 = (float)((uint)(fVar32 * fVar8 + fVar4 * fVar11 + fVar5 * fVar15) & DAT_001a7610._4_4_);
  fVar20 = ctx->circle_test[0];
  fVar21 = ctx->circle_test[1];
  fVar29 = fVar20 * fVar35 + fVar21 * fVar33;
  fVar30 = fVar20 * fVar36 + fVar21 * fVar34;
  fVar31 = fVar20 * (float)((uint)(fVar32 * fVar31 + fVar4 * fVar12 + fVar5 * fVar16) &
                           DAT_001a7610._8_4_) +
           fVar21 * (fVar6 * fVar31 + fVar18 * fVar12 + fVar19 * fVar16);
  fVar32 = fVar20 * (float)((uint)(fVar32 * fVar9 + fVar4 * fVar13 + fVar5 * fVar17) &
                           DAT_001a7610._12_4_) +
           fVar21 * (fVar6 * fVar9 + fVar18 * fVar13 + fVar19 * fVar17);
  bVar37.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] =
       (uint)(ctx->flippedBasis[6] * fVar7 +
             ctx->flippedBasis[7] * fVar10 + ctx->flippedBasis[8] * fVar14) & (uint)DAT_001a7610;
  bVar37.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] =
       (uint)(ctx->flippedBasis[6] * fVar8 +
             ctx->flippedBasis[7] * fVar11 + ctx->flippedBasis[8] * fVar15) & DAT_001a7610._4_4_;
  bVar37 = weight_from_sin(this,ctx,bVar37);
  auVar28._8_4_ = extraout_XMM0_Dc;
  auVar28._0_8_ =
       bVar37.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
       super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
       super_simd_register<float,_xsimd::sse2>.data._0_8_;
  auVar28._12_4_ = extraout_XMM0_Dd;
  bVar38.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[2] = ctx->right_circle_centre[1] * fVar33;
  bVar38.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[3] = ctx->right_circle_centre[1] * fVar34;
  bVar38.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] =
       ctx->right_circle_centre[0] * fVar35 +
       bVar38.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
       super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
       super_simd_register<float,_xsimd::sse2>.data[2];
  bVar38.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] =
       ctx->right_circle_centre[0] * fVar36 +
       bVar38.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
       super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
       super_simd_register<float,_xsimd::sse2>.data[3];
  bVar38 = weight_from_cos(this,ctx,bVar38);
  local_58 = bVar38.super_simd_register<float,_xsimd::sse4_2>.
             super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
             super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[0]
  ;
  auVar27._0_8_ =
       bVar38.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
       super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
       super_simd_register<float,_xsimd::sse2>.data._0_8_;
  auVar27._8_4_ = extraout_XMM0_Dc_00;
  auVar27._12_4_ = extraout_XMM0_Dd_00;
  auVar1._4_4_ = -(uint)(fVar30 < 0.0);
  auVar1._0_4_ = -(uint)(fVar29 < 0.0);
  auVar1._8_4_ = -(uint)(fVar31 < 0.0);
  auVar1._12_4_ = -(uint)(fVar32 < 0.0);
  iVar22 = movmskps(extraout_EAX,auVar1);
  if (iVar22 == 0) {
    local_58 = bVar37.super_simd_register<float,_xsimd::sse4_2>.
               super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
               super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data
               [0];
    fStack_54 = bVar37.super_simd_register<float,_xsimd::sse4_2>.
                super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
                super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data
                [1];
  }
  else {
    fStack_54 = bVar38.super_simd_register<float,_xsimd::sse4_2>.
                super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
                super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data
                [1];
    iVar23 = -(uint)(0.0 <= fVar29);
    iVar24 = -(uint)(0.0 <= fVar30);
    iVar25 = -(uint)(0.0 <= fVar31);
    iVar26 = -(uint)(0.0 <= fVar32);
    auVar2._4_4_ = iVar24;
    auVar2._0_4_ = iVar23;
    auVar2._8_4_ = iVar25;
    auVar2._12_4_ = iVar26;
    iVar22 = movmskps(iVar22,auVar2);
    auVar3._4_4_ = iVar24;
    auVar3._0_4_ = iVar23;
    auVar3._8_4_ = iVar25;
    auVar3._12_4_ = iVar26;
    auVar28 = blendvps(auVar27,auVar28,auVar3);
    auVar27._0_8_ = auVar28._0_8_;
    if (iVar22 != 0) {
      local_58 = auVar28._0_4_;
      fStack_54 = auVar28._4_4_;
    }
  }
  bVar39.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] = fStack_54;
  bVar39.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] = local_58;
  bVar39.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[2] = (float)(int)auVar27._0_8_;
  bVar39.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[3] = (float)(int)((ulong)auVar27._0_8_ >> 0x20);
  return (batch)bVar39.super_simd_register<float,_xsimd::sse4_2>.
                super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
                super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data
  ;
}

Assistant:

batch weight_stadium(PolarExtentCoreContext &ctx,
                         const PositionBatch<batch> &position) const {
      PositionBatch<batch> position_t = position.transform(ctx.flippedBasis);

      PositionBatch<batch> position_t_right = position_t;
      position_t_right.x = xsimd::abs(position_t.x);

      auto circle_test_dot =
          xsimd::fma(position_t_right.x, batch{ctx.circle_test[0]},
                     position_t_right.y * batch{ctx.circle_test[1]});
      auto in_straight_line_part = circle_test_dot >= batch{0.0};

      // for the straight line part
      auto straight_val = weight_from_sin(ctx, xsimd::abs(position_t.z));

      // for the circle part
      auto circle_dot =
          xsimd::fma(position_t_right.x, batch{ctx.right_circle_centre[0]},
                     position_t_right.y * batch{ctx.right_circle_centre[1]});
      auto circle_val = weight_from_cos(ctx, circle_dot);

      if (xsimd::all(in_straight_line_part))
        return straight_val;
      else if (xsimd::none(in_straight_line_part))
        return circle_val;
      else
        return xsimd::select(in_straight_line_part, straight_val, circle_val);
    }